

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Io_ReadFinType(char *pThis)

{
  int iVar1;
  char *pThis_local;
  
  iVar1 = strcmp(pThis,"SA0");
  if (iVar1 == 0) {
    pThis_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(pThis,"SA1");
    if (iVar1 == 0) {
      pThis_local._4_4_ = 2;
    }
    else {
      iVar1 = strcmp(pThis,"NEG");
      if (iVar1 == 0) {
        pThis_local._4_4_ = 3;
      }
      else {
        iVar1 = strcmp(pThis,"RDOB_AND");
        if (iVar1 == 0) {
          pThis_local._4_4_ = 4;
        }
        else {
          iVar1 = strcmp(pThis,"RDOB_NAND");
          if (iVar1 == 0) {
            pThis_local._4_4_ = 5;
          }
          else {
            iVar1 = strcmp(pThis,"RDOB_OR");
            if (iVar1 == 0) {
              pThis_local._4_4_ = 6;
            }
            else {
              iVar1 = strcmp(pThis,"RDOB_NOR");
              if (iVar1 == 0) {
                pThis_local._4_4_ = 7;
              }
              else {
                iVar1 = strcmp(pThis,"RDOB_XOR");
                if (iVar1 == 0) {
                  pThis_local._4_4_ = 8;
                }
                else {
                  iVar1 = strcmp(pThis,"RDOB_NXOR");
                  if (iVar1 == 0) {
                    pThis_local._4_4_ = 9;
                  }
                  else {
                    iVar1 = strcmp(pThis,"RDOB_NOT");
                    if (iVar1 == 0) {
                      pThis_local._4_4_ = 10;
                    }
                    else {
                      iVar1 = strcmp(pThis,"RDOB_BUFF");
                      if (iVar1 == 0) {
                        pThis_local._4_4_ = 0xb;
                      }
                      else {
                        pThis_local._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pThis_local._4_4_;
}

Assistant:

int Io_ReadFinType( char * pThis )
{
    if ( !strcmp(pThis, "SA0") )        return ABC_FIN_SA0;
    if ( !strcmp(pThis, "SA1") )        return ABC_FIN_SA1;
    if ( !strcmp(pThis, "NEG") )        return ABC_FIN_NEG;
    if ( !strcmp(pThis, "RDOB_AND") )   return ABC_FIN_RDOB_AND;
    if ( !strcmp(pThis, "RDOB_NAND") )  return ABC_FIN_RDOB_NAND;
    if ( !strcmp(pThis, "RDOB_OR") )    return ABC_FIN_RDOB_OR;
    if ( !strcmp(pThis, "RDOB_NOR") )   return ABC_FIN_RDOB_NOR;
    if ( !strcmp(pThis, "RDOB_XOR") )   return ABC_FIN_RDOB_XOR;
    if ( !strcmp(pThis, "RDOB_NXOR") )  return ABC_FIN_RDOB_NXOR;
    if ( !strcmp(pThis, "RDOB_NOT") )   return ABC_FIN_RDOB_NOT;
    if ( !strcmp(pThis, "RDOB_BUFF") )  return ABC_FIN_RDOB_BUFF;
    return ABC_FIN_NONE;
}